

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O2

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_mode cVar3;
  cs_detail *pcVar4;
  int reg_00;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  x86_reg xVar8;
  undefined8 in_RAX;
  MCOperand *pMVar9;
  int64_t iVar10;
  MCRegisterClass *c;
  char *s;
  ulong uVar11;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *O_00;
  x86_avx_bcast v;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  x86_reg reg2;
  x86_reg reg;
  
  _reg2 = in_RAX;
  uVar6 = MCInst_getOpcode(MI);
  if (uVar6 == 0x1879) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 0) {
      pcVar13 = "xstorerng";
LAB_0019fd39:
      s = cs_strdup(pcVar13);
      for (pcVar13 = s; cVar2 = *pcVar13, cVar2 != '\0'; pcVar13 = pcVar13 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar13 = '\0';
          pcVar13 = pcVar13 + 1;
          break;
        }
      }
      SStream_concat0(O,s);
      if (*pcVar13 != '\0') {
        SStream_concat0(O,anon_var_dwarf_73fa9 + 0x11);
        do {
          cVar2 = *pcVar13;
          if (cVar2 == '$') {
            if (pcVar13[1] == -1) {
              pcVar14 = pcVar13 + 3;
              if (pcVar13[3] == '\x01') {
                printf64mem(MI,(int)pcVar13[2] - 1,O);
              }
            }
            else {
              pcVar14 = pcVar13 + 1;
              printOperand(MI,(int)pcVar13[1] - 1,O);
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            pcVar14 = pcVar13;
          }
          pcVar13 = pcVar14 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto switchD_0019fe77_default;
      }
    }
  }
  else if (uVar6 == 0x16) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 1) {
      pMVar9 = MCInst_getOperand(MI,0);
      _Var5 = MCOperand_isImm(pMVar9);
      if (_Var5) {
        pMVar9 = MCInst_getOperand(MI,0);
        iVar10 = MCOperand_getImm(pMVar9);
        if (iVar10 == 10) {
          pcVar13 = "aam";
          goto LAB_0019fd39;
        }
      }
    }
  }
  else if (uVar6 == 0x269) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 6) {
      pMVar9 = MCInst_getOperand(MI,0);
      _Var5 = MCOperand_isReg(pMVar9);
      if (_Var5) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar9 = MCInst_getOperand(MI,0);
        uVar6 = MCOperand_getReg(pMVar9);
        _Var5 = MCRegisterClass_contains(c,uVar6);
        if (_Var5) {
          pcVar13 = anon_var_dwarf_e7f3b;
          goto LAB_0019fd39;
        }
      }
    }
  }
  else if (uVar6 == 0x15) {
    uVar6 = MCInst_getNumOperands(MI);
    if (uVar6 == 1) {
      pMVar9 = MCInst_getOperand(MI,0);
      _Var5 = MCOperand_isImm(pMVar9);
      if (_Var5) {
        pMVar9 = MCInst_getOperand(MI,0);
        iVar10 = MCOperand_getImm(pMVar9);
        if (iVar10 == 10) {
          pcVar13 = "aad";
          goto LAB_0019fd39;
        }
      }
    }
  }
  uVar7 = MCInst_getOpcode(MI);
  uVar6 = *(uint *)(printInstruction_OpInfo + (ulong)uVar7 * 4);
  uVar7 = *(uint *)(printInstruction_OpInfo2 + (ulong)uVar7 * 4);
  _Var5 = X86_lockrep(MI,O);
  if (!_Var5) {
    SStream_concat0(O,(char *)((ulong)(uVar6 & 0x3fff) + 0x33301f));
  }
  switch(uVar6 >> 0xe & 0x3f) {
  case 1:
    uVar12 = 0;
    goto LAB_0019fff1;
  case 2:
    printi16mem(MI,0,O);
    break;
  case 3:
    uVar12 = 1;
LAB_0019fff1:
    printOperand(MI,uVar12,O);
    break;
  case 4:
    printi32mem(MI,0,O);
    break;
  case 5:
    printi64mem(MI,0,O);
    break;
  case 6:
    printi8mem(MI,0,O);
    break;
  case 7:
    printf32mem(MI,0,O);
    break;
  case 8:
    printf64mem(MI,0,O);
    break;
  case 9:
    pMVar9 = MCInst_getOperand(MI,0);
    _Var5 = MCOperand_isImm(pMVar9);
    if (_Var5) {
      iVar10 = MCOperand_getImm(pMVar9);
      uVar11 = (ulong)MI->flat_insn->size + iVar10 + MI->address;
      cVar3 = MI->csh->mode;
      uVar15 = uVar11 & 0xffffffff;
      if (cVar3 == CS_MODE_64) {
        uVar15 = uVar11;
      }
      uVar12 = MI->Opcode;
      if (cVar3 == CS_MODE_16) {
        if ((uVar12 != 0x163) && (uVar12 != 0x44f)) {
          uVar15 = uVar11 & 0xffff;
        }
        if (uVar12 != 0x44f) goto LAB_001a07c3;
        if (MI->x86_prefix[2] != 'f') goto LAB_001a07d1;
LAB_001a07d7:
        if (-1 < (long)uVar15) goto LAB_001a07dc;
LAB_001a07e2:
        pcVar13 = " + 0x%lx";
      }
      else {
LAB_001a07c3:
        if ((uVar12 != 0x44e) && (uVar12 != 0x162)) goto LAB_001a07d7;
LAB_001a07d1:
        uVar15 = uVar15 & 0xffff;
LAB_001a07dc:
        if (9 < uVar15) goto LAB_001a07e2;
        pcVar13 = " + %lu";
      }
      SStream_concat(O,pcVar13 + 3,uVar15);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.op_count * 0x30 + 0x3e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        uVar11 = (ulong)(pcVar4->field_6).x86.op_count;
        if (uVar11 == 0) {
          *(uint8_t *)((long)&pcVar4->field_6 + 0x50) = MI->imm_size;
        }
        else {
          pcVar4->groups[uVar11 * 0x30 + 0x5e] = *(uint8_t *)((long)&pcVar4->field_6 + 0x50);
        }
        pcVar4 = MI->flat_insn->detail;
        *(ulong *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.op_count * 0x30 + 0x46) = uVar15;
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (MI->op1_size == '\0') {
        MI->op1_size = MI->imm_size;
      }
    }
    break;
  case 10:
    uVar12 = 7;
    goto LAB_001a0104;
  case 0xb:
    uVar12 = 3;
LAB_001a0104:
    printSSECC(MI,uVar12,O);
    break;
  case 0xc:
    printSrcIdx8(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx8(MI,0,O);
    goto switchD_0019fe77_default;
  case 0xd:
    printSrcIdx32(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx32(MI,0,O);
    goto switchD_0019fe77_default;
  case 0xe:
    printSrcIdx64(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx64(MI,0,O);
    goto switchD_0019fe77_default;
  case 0xf:
    printSrcIdx16(MI,1,O);
    SStream_concat0(O,", ");
    printDstIdx16(MI,0,O);
    goto switchD_0019fe77_default;
  case 0x10:
    printi128mem(MI,0,O);
    break;
  case 0x11:
    uVar6 = 0;
    goto LAB_001a05f2;
  case 0x12:
    printDstIdx8(MI,0,O);
    break;
  case 0x13:
    printDstIdx32(MI,0,O);
    break;
  case 0x14:
    printDstIdx16(MI,0,O);
    break;
  case 0x15:
    uVar12 = 7;
    goto LAB_001a009e;
  case 0x16:
    uVar12 = 3;
LAB_001a009e:
    printAVXCC(MI,uVar12,O);
    break;
  case 0x17:
    SStream_concat0(O,"xword ptr ");
    MI->x86opsize = '\n';
    printMemReference(MI,0,O);
    goto switchD_0019fe77_default;
  case 0x18:
    uVar6 = 0;
    goto LAB_001a0673;
  case 0x19:
    uVar6 = 0;
    goto LAB_001a0593;
  case 0x1a:
    uVar6 = 0;
    goto LAB_001a05b9;
  case 0x1b:
    uVar6 = 0;
    goto LAB_001a0660;
  case 0x1c:
    printi16mem(MI,2,O);
    goto LAB_001a0462;
  case 0x1d:
    printi32mem(MI,2,O);
    goto LAB_001a0462;
  case 0x1e:
    printi64mem(MI,2,O);
    goto LAB_001a0462;
  case 0x1f:
    printi8mem(MI,2,O);
    goto LAB_001a0462;
  case 0x20:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    O_00 = extraout_RDX_01;
    goto LAB_001a01c7;
  case 0x21:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    O_00 = extraout_RDX_02;
    goto LAB_001a01c7;
  case 0x22:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    O_00 = extraout_RDX_00;
    goto LAB_001a01c7;
  case 0x23:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    O_00 = extraout_RDX;
LAB_001a01c7:
    printMemOffset(MI,(uint)O,O_00);
    break;
  case 0x24:
    printf128mem(MI,0,O);
    break;
  case 0x25:
    printDstIdx64(MI,0,O);
    break;
  case 0x26:
    printf256mem(MI,0,O);
    break;
  case 0x27:
    printi256mem(MI,0,O);
    break;
  case 0x28:
    printf512mem(MI,0,O);
    break;
  case 0x29:
    printi512mem(MI,0,O);
    break;
  case 0x2a:
    printi32mem(MI,1,O);
    goto LAB_001a040a;
  case 0x2b:
    printi64mem(MI,1,O);
LAB_001a040a:
    SStream_concat0(O," {");
    printOperand(MI,6,O);
    pcVar13 = "}, ";
    goto LAB_001a042e;
  case 0x2c:
    printOperand(MI,2,O);
LAB_001a0462:
    SStream_concat0(O,", ");
    uVar6 = 1;
    goto LAB_001a0477;
  default:
    goto switchD_0019fe77_default;
  }
  pcVar13 = ", ";
  switch(uVar6 >> 0x14 & 0x1f) {
  case 1:
    break;
  case 2:
    SStream_concat0(O,", st(0)");
    reg_00 = 0x6a;
    goto LAB_001a071a;
  case 3:
    pcVar13 = "pd\t";
    goto LAB_001a02e5;
  case 4:
    pcVar13 = "ps\t";
    goto LAB_001a02e5;
  case 5:
    pcVar13 = "sd\t";
    goto LAB_001a02e5;
  case 6:
    pcVar13 = "ss\t";
LAB_001a02e5:
    SStream_concat0(O,pcVar13);
    uVar12 = 0;
    goto LAB_001a0366;
  case 7:
    SStream_concat0(O,":");
    goto switchD_001a039d_caseD_18;
  case 8:
    SStream_concat0(O,", dx");
    reg_00 = 0x12;
    goto LAB_001a071a;
  case 9:
    SStream_concat0(O,", ax");
    reg_00 = 3;
    goto LAB_001a071a;
  case 10:
    SStream_concat0(O,", eax");
    reg_00 = 0x13;
    goto LAB_001a071a;
  case 0xb:
    SStream_concat0(O,", rax");
    reg_00 = 0x23;
    goto LAB_001a071a;
  case 0xc:
    SStream_concat0(O,", al");
    reg_00 = 2;
    goto LAB_001a071a;
  case 0xd:
    SStream_concat0(O,", 1");
    op_addImm(MI,1);
    goto switchD_0019fe77_default;
  case 0xe:
    goto switchD_001a01fd_caseD_e;
  default:
    goto switchD_0019fe77_default;
  case 0x10:
    pcVar13 = " {";
    break;
  case 0x11:
    pcVar13 = "pd \t";
    goto LAB_001a0339;
  case 0x12:
    pcVar13 = "ps \t";
    goto LAB_001a0339;
  case 0x13:
    pcVar13 = "}, ";
    break;
  case 0x14:
    pcVar13 = "d\t";
    goto LAB_001a0339;
  case 0x15:
    pcVar13 = "q\t";
    goto LAB_001a0339;
  case 0x16:
    pcVar13 = "ud\t";
    goto LAB_001a0339;
  case 0x17:
    pcVar13 = "uq\t";
LAB_001a0339:
    SStream_concat0(O,pcVar13);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar12 = 1;
LAB_001a0366:
    pcVar13 = ", ";
    printOperand(MI,uVar12,O);
  }
  SStream_concat0(O,pcVar13);
  switch(uVar6 >> 0x19 & 0x3f) {
  case 1:
    uVar12 = 2;
    goto LAB_001a06c6;
  case 2:
    uVar12 = 2;
    goto LAB_001a05c8;
  case 3:
    uVar12 = 2;
    goto LAB_001a0614;
  case 4:
    uVar12 = 2;
    goto LAB_001a0601;
  case 5:
    uVar12 = 2;
    goto LAB_001a04d0;
  case 6:
    uVar12 = 2;
    goto LAB_001a05a2;
  case 7:
    printf64mem(MI,2,O);
    break;
  case 8:
    printf32mem(MI,2,O);
    break;
  case 9:
    uVar12 = 1;
LAB_001a0614:
    printi32mem(MI,uVar12,O);
    break;
  case 10:
    uVar12 = 1;
    goto LAB_001a06c6;
  case 0xb:
    uVar12 = 1;
LAB_001a0601:
    printi64mem(MI,uVar12,O);
    break;
  case 0xc:
    uVar12 = 2;
    goto LAB_001a04e3;
  case 0xd:
    uVar12 = 1;
LAB_001a04e3:
    printi128mem(MI,uVar12,O);
    break;
  case 0xe:
    uVar12 = 1;
LAB_001a05c8:
    printi16mem(MI,uVar12,O);
    break;
  case 0xf:
    uVar12 = 1;
LAB_001a04d0:
    printi8mem(MI,uVar12,O);
    break;
  case 0x10:
    uVar12 = 1;
LAB_001a05a2:
    printf128mem(MI,uVar12,O);
    break;
  case 0x11:
    printf64mem(MI,1,O);
    goto switchD_0019fe77_default;
  case 0x12:
    printf32mem(MI,1,O);
    goto switchD_0019fe77_default;
  case 0x13:
    uVar6 = 1;
LAB_001a05f2:
    printopaquemem(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 0x14:
    uVar6 = 1;
LAB_001a0673:
    printSrcIdx8(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 0x15:
    uVar6 = 1;
LAB_001a0593:
    printSrcIdx32(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 0x16:
    uVar6 = 1;
LAB_001a05b9:
    printSrcIdx64(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 0x17:
    uVar6 = 1;
LAB_001a0660:
    printSrcIdx16(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 0x18:
switchD_001a039d_caseD_18:
    uVar6 = 0;
    goto LAB_001a0477;
  case 0x19:
    printi256mem(MI,1,O);
    break;
  case 0x1a:
    printf512mem(MI,2,O);
    SStream_concat0(O,", ");
    printAVXCC(MI,7,O);
    goto switchD_0019fe77_default;
  case 0x1b:
    printi512mem(MI,1,O);
    break;
  case 0x1c:
    printf256mem(MI,1,O);
    break;
  case 0x1d:
    printf512mem(MI,1,O);
    break;
  case 0x1e:
    printi64mem(MI,3,O);
    goto LAB_001a069e;
  case 0x1f:
    printOperand(MI,3,O);
    SStream_concat0(O,"}, ");
    break;
  case 0x20:
    printi32mem(MI,3,O);
LAB_001a069e:
    SStream_concat0(O,", ");
    goto LAB_001a06ad;
  case 0x21:
    uVar6 = 2;
    goto LAB_001a0649;
  default:
    uVar12 = 5;
LAB_001a06c6:
    printOperand(MI,uVar12,O);
  }
  switch((uint)(CONCAT44(uVar7,uVar6) >> 0x1f) & 0xf) {
  case 1:
    pcVar13 = ", ";
    goto LAB_001a072f;
  case 3:
switchD_001a01fd_caseD_e:
    SStream_concat0(O,", cl");
    reg_00 = 10;
LAB_001a071a:
    op_addReg(MI,reg_00);
    break;
  case 4:
    pcVar13 = "}, ";
LAB_001a072f:
    SStream_concat0(O,pcVar13);
LAB_001a0750:
    switch(uVar7 >> 3 & 0x1f) {
    case 1:
      printOperand(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
switchD_001a06fe_caseD_6:
        SStream_concat0(O,", {sae}");
        op_addAvxSae(MI);
        break;
      }
    case 2:
      printi32mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 3:
      printi64mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 4:
      goto switchD_001a0774_caseD_4;
    case 5:
      printOperand(MI,3,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 6:
      printf64mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 7:
      printf32mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 8:
      printf256mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 9:
      printf512mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 10:
      printf128mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0xb:
      printi128mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0xc:
      printi512mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0xd:
      printi256mem(MI,2,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0xe:
      pMVar9 = MCInst_getOperand(MI,2);
      iVar10 = MCOperand_getImm(pMVar9);
      uVar6 = (uint)iVar10 & 3;
      SStream_concat0(O,&DAT_002442d0 + *(int *)(&DAT_002442d0 + (ulong)uVar6 * 4));
      op_addAvxSae(MI);
      op_addAvxRoundingMode(MI,uVar6 + 1);
      break;
    case 0xf:
switchD_001a0774_caseD_f:
      printf512mem(MI,3,O);
      break;
    case 0x10:
      printf64mem(MI,3,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0x11:
      printf32mem(MI,3,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    case 0x12:
      printf128mem(MI,3,O);
      break;
    case 0x13:
      printf256mem(MI,3,O);
      break;
    case 0x14:
switchD_001a0774_caseD_14:
      printi128mem(MI,3,O);
      break;
    case 0x15:
switchD_001a0774_caseD_15:
      printi256mem(MI,3,O);
      break;
    case 0x16:
      uVar6 = 3;
LAB_001a0649:
      printi512mem(MI,uVar6,O);
      break;
    case 0x17:
      printi32mem(MI,3,O);
switchD_001a06fe_caseD_9:
      SStream_concat0(O,"{1to16}");
      v = X86_AVX_BCAST_16;
LAB_001a0d39:
      op_addAvxBroadcast(MI,v);
      break;
    case 0x18:
      v = X86_AVX_BCAST_8;
      printi64mem(MI,3,O);
      pcVar13 = "{1to8}";
LAB_001a0b7b:
      SStream_concat0(O,pcVar13);
      goto LAB_001a0d39;
    case 0x19:
      printi8mem(MI,2,O);
      goto LAB_001a09cf;
    case 0x1a:
      printi16mem(MI,2,O);
LAB_001a09cf:
      pcVar13 = ", ";
LAB_001a042e:
      SStream_concat0(O,pcVar13);
switchD_001a0774_caseD_4:
      uVar6 = 7;
      goto LAB_001a0477;
    default:
      printOperand(MI,6,O);
      switch(uVar7 >> 8 & 7) {
      default:
        break;
      case 1:
        goto switchD_001a0bb2_caseD_1;
      case 2:
        goto switchD_001a06fe_caseD_a;
      case 3:
        goto switchD_001a06fe_caseD_9;
      case 4:
        goto switchD_001a0bb2_caseD_4;
      case 5:
        goto switchD_001a0bb2_caseD_5;
      case 6:
        goto switchD_001a06fe_caseD_6;
      }
    }
    break;
  case 5:
    SStream_concat0(O,"} {z}, ");
    op_addAvxZeroOpmask(MI);
    goto LAB_001a0750;
  case 6:
    goto switchD_001a06fe_caseD_6;
  case 7:
    printi64mem(MI,4,O);
    break;
  case 8:
    printi32mem(MI,4,O);
    break;
  case 9:
    goto switchD_001a06fe_caseD_9;
  case 10:
    goto switchD_001a06fe_caseD_a;
  }
switchD_0019fe77_default:
  uVar6 = MCInst_getOpcode(MI);
  xVar8 = X86_insn_reg_intel(uVar6);
  uVar15 = (ulong)xVar8;
  if (MI->csh->detail != CS_OPT_OFF) {
    reg = xVar8;
    if (xVar8 == X86_REG_INVALID) {
      uVar6 = MCInst_getOpcode(MI);
      _Var5 = X86_insn_reg_intel2(uVar6,&reg,&reg2);
      uVar15 = (ulong)reg;
      if (_Var5) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = reg;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[uVar15];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = reg2;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[reg2];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar4 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar4->field_6 + 0x60),(void *)((long)&pcVar4->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar8;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar8];
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[xVar8];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  if ((int)uVar15 != 0 && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[uVar15];
  }
  return;
switchD_001a0bb2_caseD_1:
  SStream_concat0(O,", ");
  switch(uVar7 >> 0xb & 0xf) {
  case 0:
    uVar6 = 4;
    goto LAB_001a0c94;
  case 1:
    uVar6 = 7;
    goto LAB_001a0c94;
  case 2:
    printf64mem(MI,3,O);
    break;
  case 3:
    goto switchD_001a0774_caseD_f;
  case 4:
    uVar6 = 3;
LAB_001a0c94:
    printOperand(MI,uVar6,O);
    break;
  case 5:
    printf32mem(MI,3,O);
    break;
  case 6:
    printf128mem(MI,3,O);
    break;
  case 7:
    printf256mem(MI,3,O);
    break;
  case 8:
    v = X86_AVX_BCAST_16;
    printi32mem(MI,4,O);
    pcVar13 = "{1to16}";
    goto LAB_001a0b7b;
  case 9:
    printi32mem(MI,3,O);
    break;
  case 10:
    uVar6 = 4;
    goto LAB_001a0649;
  case 0xb:
    printi512mem(MI,3,O);
    break;
  case 0xc:
    printi64mem(MI,4,O);
    goto switchD_001a06fe_caseD_a;
  case 0xd:
    printi64mem(MI,3,O);
    break;
  case 0xe:
    goto switchD_001a0774_caseD_14;
  case 0xf:
    goto switchD_001a0774_caseD_15;
  }
  switch(uVar7 >> 0xf & 7) {
  case 1:
    SStream_concat0(O,", ");
    uVar6 = uVar7 >> 0x12 & 3;
    if (uVar6 == 1) {
      uVar6 = 5;
    }
    else if (uVar6 == 2) {
      uVar6 = 4;
    }
    else {
LAB_001a06ad:
      uVar6 = 8;
    }
LAB_001a0477:
    printOperand(MI,uVar6,O);
    goto switchD_0019fe77_default;
  case 2:
switchD_001a06fe_caseD_a:
    SStream_concat0(O,"{1to8}");
    v = X86_AVX_BCAST_8;
    break;
  case 3:
    goto switchD_001a06fe_caseD_9;
  case 4:
switchD_001a0bb2_caseD_4:
    SStream_concat0(O,"{1to4}");
    v = X86_AVX_BCAST_4;
    break;
  case 5:
switchD_001a0bb2_caseD_5:
    SStream_concat0(O,"{1to2}");
    v = X86_AVX_BCAST_2;
    break;
  default:
    goto switchD_0019fe77_default;
  }
  goto LAB_001a0d39;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}